

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_encode.cpp
# Opt level: O0

void __thiscall
ktx::CommandEncode::processOptions(CommandEncode *this,Options *opts,ParseResult *args)

{
  bool bVar1;
  byte bVar2;
  Options *in_RDX;
  Combine<ktx::CommandEncode::OptionsEncode,_ktx::OptionsEncodeASTC,_ktx::OptionsEncodeBasis<true>,_ktx::OptionsEncodeCommon,_ktx::OptionsMetrics,_ktx::OptionsDeflate,_ktx::OptionsSingleInSingleOut,_ktx::OptionsGeneric>
  *in_RSI;
  Reporter *in_RDI;
  bool canCompare;
  bool astcCodec;
  bool basisCodec;
  Reporter *in_stack_00000038;
  bool local_2a;
  bool local_29;
  undefined5 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe5;
  undefined1 in_stack_ffffffffffffffe6;
  undefined1 in_stack_ffffffffffffffe7;
  
  Combine<ktx::CommandEncode::OptionsEncode,_ktx::OptionsEncodeASTC,_ktx::OptionsEncodeBasis<true>,_ktx::OptionsEncodeCommon,_ktx::OptionsMetrics,_ktx::OptionsDeflate,_ktx::OptionsSingleInSingleOut,_ktx::OptionsGeneric>
  ::process(in_RSI,in_RDX,
            (ParseResult *)
            CONCAT17(in_stack_ffffffffffffffe7,
                     CONCAT16(in_stack_ffffffffffffffe6,
                              CONCAT15(in_stack_ffffffffffffffe5,in_stack_ffffffffffffffe0))),in_RDI
           );
  fillOptionsCodecBasis<ktx::Combine<ktx::CommandEncode::OptionsEncode,ktx::OptionsEncodeASTC,ktx::OptionsEncodeBasis<true>,ktx::OptionsEncodeCommon,ktx::OptionsMetrics,ktx::OptionsDeflate,ktx::OptionsSingleInSingleOut,ktx::OptionsGeneric>>
            ((Combine<ktx::CommandEncode::OptionsEncode,_ktx::OptionsEncodeASTC,_ktx::OptionsEncodeBasis<true>,_ktx::OptionsEncodeCommon,_ktx::OptionsMetrics,_ktx::OptionsDeflate,_ktx::OptionsSingleInSingleOut,_ktx::OptionsGeneric>
              *)0x25eb75);
  if ((((int)in_RDI[6].commandDescription._M_string_length == 0) ||
      ((int)in_RDI[6].commandDescription._M_string_length == 0x7fffffff)) &&
     ((int)in_RDI[1].commandName._M_string_length == 0)) {
    Reporter::fatal_usage<char_const(&)[41]>(in_stack_00000038,(char (*) [41])this);
  }
  if ((int)in_RDI[6].commandDescription._M_string_length == 1) {
    bVar1 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x25ebdb);
    if (bVar1) {
      Reporter::fatal_usage<char_const(&)[54]>(in_stack_00000038,(char (*) [54])this);
    }
    bVar1 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x25ec0f);
    if (bVar1) {
      Reporter::fatal_usage<char_const(&)[54]>(in_stack_00000038,(char (*) [54])this);
    }
  }
  local_29 = true;
  if ((int)in_RDI[6].commandDescription._M_string_length != 1) {
    local_29 = (int)in_RDI[6].commandDescription._M_string_length == 2;
  }
  bVar2 = isFormatAstc((VkFormat)in_RDI[1].commandName._M_string_length);
  local_2a = true;
  if ((local_29 & 1U) == 0) {
    local_2a = (bool)bVar2;
  }
  if (((in_RDI[7].commandName.field_2._M_local_buf[9] & 1U) != 0) && (local_2a == false)) {
    Reporter::fatal_usage<char_const(&)[70]>(in_stack_00000038,(char (*) [70])this);
  }
  if (((in_RDI[7].commandName.field_2._M_local_buf[10] & 1U) != 0) && ((local_2a & 1U) == 0)) {
    Reporter::fatal_usage<char_const(&)[70]>(in_stack_00000038,(char (*) [70])this);
  }
  if ((bVar2 & 1) != 0) {
    in_RDI[2].commandName.field_2._M_local_buf[0] = '\x01';
  }
  return;
}

Assistant:

void CommandEncode::processOptions(cxxopts::Options& opts, cxxopts::ParseResult& args) {
    options.process(opts, args, *this);

    fillOptionsCodecBasis<decltype(options)>(options);

    if ((options.codec == BasisCodec::NONE || options.codec == BasisCodec::INVALID) &&
        options.vkFormat == VK_FORMAT_UNDEFINED)
        fatal_usage("Either codec or format must be specified");

    if (options.codec == BasisCodec::BasisLZ) {
        if (options.zstd.has_value())
            fatal_usage("Cannot encode to BasisLZ and supercompress with Zstd.");

        if (options.zlib.has_value())
            fatal_usage("Cannot encode to BasisLZ and supercompress with ZLIB.");
    }

    const auto basisCodec = options.codec == BasisCodec::BasisLZ || options.codec == BasisCodec::UASTC;
    const auto astcCodec = isFormatAstc(options.vkFormat);
    const auto canCompare = basisCodec || astcCodec;

    if (options.compare_ssim && !canCompare)
        fatal_usage("--compare-ssim can only be used with BasisLZ, UASTC or ASTC encoding.");
    if (options.compare_psnr && !canCompare)
        fatal_usage("--compare-psnr can only be used with BasisLZ, UASTC or ASTC encoding.");

    if (astcCodec)
        options.encodeASTC = true;
}